

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O1

void __thiscall
BamTools::Internal::BamToolsIndex::LoadReferenceSummary
          (BamToolsIndex *this,BtiReferenceSummary *refSummary)

{
  int iVar1;
  undefined4 extraout_var;
  int numBlocks;
  int local_24;
  long local_20;
  
  LoadNumBlocks(this,&local_24);
  refSummary->NumBlocks = local_24;
  iVar1 = (*((this->m_resources).Device)->_vptr_IBamIODevice[7])();
  refSummary->FirstBlockFilePosition = CONCAT44(extraout_var,iVar1);
  local_20 = (long)local_24 << 4;
  Seek(this,&local_20,1);
  return;
}

Assistant:

void BamToolsIndex::LoadReferenceSummary(BtiReferenceSummary& refSummary)
{

    // load number of blocks
    int numBlocks;
    LoadNumBlocks(numBlocks);

    // store block summary data for this reference
    refSummary.NumBlocks = numBlocks;
    refSummary.FirstBlockFilePosition = Tell();

    // skip reference's blocks
    SkipBlocks(numBlocks);
}